

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *values)

{
  uintptr_t in_RAX;
  ArrayNewFixed *pAVar1;
  Type local_28;
  
  local_28.id = in_RAX;
  pAVar1 = MixedArena::alloc<wasm::ArrayNewFixed>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pAVar1->values,
             values);
  wasm::Type::Type(&local_28,type,NonNullable);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_28.id;
  wasm::ArrayNewFixed::finalize();
  return pAVar1;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type,
                                   const std::vector<Expression*>& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }